

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particles.c
# Opt level: O0

void init_particle(PARTICLE *p,double t)

{
  uint uVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  float velocity;
  float xy_angle;
  double t_local;
  PARTICLE *p_local;
  
  p->x = 0.0;
  p->y = 0.0;
  p->z = 3.0;
  uVar1 = rand();
  p->vz = (float)(uVar1 & 0xfff) * 7.324219e-05 + 0.7;
  uVar1 = rand();
  fVar2 = (float)(uVar1 & 0xfff) * 0.0015339808;
  dVar3 = cos((double)fVar2);
  p->vx = (float)dVar3 * 0.4;
  dVar3 = sin((double)fVar2);
  p->vy = (float)dVar3 * 0.4;
  dVar3 = sin(t * 0.5);
  dVar4 = sin(t * 1.31);
  fVar2 = ((float)(dVar3 + dVar4) * 0.1 + 0.8) * 8.0;
  p->vx = fVar2 * p->vx;
  p->vy = fVar2 * p->vy;
  p->vz = fVar2 * p->vz;
  dVar3 = sin(t * 0.34 + 0.1);
  p->r = (float)dVar3 * 0.3 + 0.7;
  dVar3 = sin(t * 0.63 + 1.1);
  p->g = (float)dVar3 * 0.4 + 0.6;
  dVar3 = sin(t * 0.91 + 2.1);
  p->b = (float)dVar3 * 0.4 + 0.6;
  dVar3 = sin(t * 1.34);
  glow_pos[0] = (float)dVar3 * 0.4;
  dVar3 = sin(t * 3.11);
  glow_pos[1] = (float)dVar3 * 0.4;
  glow_pos[2] = 4.0;
  glow_pos[3] = 1.0;
  glow_color[0] = p->r;
  glow_color[1] = p->g;
  glow_color[2] = p->b;
  glow_color[3] = 1.0;
  p->life = 1.0;
  p->active = 1;
  return;
}

Assistant:

static void init_particle(PARTICLE *p, double t)
{
    float xy_angle, velocity;

    // Start position of particle is at the fountain blow-out
    p->x = 0.f;
    p->y = 0.f;
    p->z = FOUNTAIN_HEIGHT;

    // Start velocity is up (Z)...
    p->vz = 0.7f + (0.3f / 4096.f) * (float) (rand() & 4095);

    // ...and a randomly chosen X/Y direction
    xy_angle = (2.f * (float) M_PI / 4096.f) * (float) (rand() & 4095);
    p->vx = 0.4f * (float) cos(xy_angle);
    p->vy = 0.4f * (float) sin(xy_angle);

    // Scale velocity vector according to a time-varying velocity
    velocity = VELOCITY * (0.8f + 0.1f * (float) (sin(0.5 * t) + sin(1.31 * t)));
    p->vx *= velocity;
    p->vy *= velocity;
    p->vz *= velocity;

    // Color is time-varying
    p->r = 0.7f + 0.3f * (float) sin(0.34 * t + 0.1);
    p->g = 0.6f + 0.4f * (float) sin(0.63 * t + 1.1);
    p->b = 0.6f + 0.4f * (float) sin(0.91 * t + 2.1);

    // Store settings for fountain glow lighting
    glow_pos[0] = 0.4f * (float) sin(1.34 * t);
    glow_pos[1] = 0.4f * (float) sin(3.11 * t);
    glow_pos[2] = FOUNTAIN_HEIGHT + 1.f;
    glow_pos[3] = 1.f;
    glow_color[0] = p->r;
    glow_color[1] = p->g;
    glow_color[2] = p->b;
    glow_color[3] = 1.f;

    // The particle is new-born and active
    p->life = 1.f;
    p->active = 1;
}